

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

void __thiscall glslang::TReflection::dump(TReflection *this)

{
  char *pcVar1;
  uint uVar2;
  size_type sVar3;
  reference pvVar4;
  int local_44;
  ulong uStack_40;
  int dim;
  size_t i_5;
  size_t i_4;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  TReflection *this_local;
  
  printf("Uniform reflection:\n");
  i_1 = 0;
  while( true ) {
    sVar3 = std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::
            size(&this->indexToUniform);
    if (sVar3 <= i_1) break;
    pvVar4 = std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::
             operator[](&this->indexToUniform,i_1);
    TObjectReflection::dump(pvVar4);
    i_1 = i_1 + 1;
  }
  printf("\n");
  printf("Uniform block reflection:\n");
  i_2 = 0;
  while( true ) {
    sVar3 = std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::
            size(&this->indexToUniformBlock);
    if (sVar3 <= i_2) break;
    pvVar4 = std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::
             operator[](&this->indexToUniformBlock,i_2);
    TObjectReflection::dump(pvVar4);
    i_2 = i_2 + 1;
  }
  printf("\n");
  printf("Buffer variable reflection:\n");
  i_3 = 0;
  while( true ) {
    sVar3 = std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::
            size(&this->indexToBufferVariable);
    if (sVar3 <= i_3) break;
    pvVar4 = std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::
             operator[](&this->indexToBufferVariable,i_3);
    TObjectReflection::dump(pvVar4);
    i_3 = i_3 + 1;
  }
  printf("\n");
  printf("Buffer block reflection:\n");
  i_4 = 0;
  while( true ) {
    sVar3 = std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::
            size(&this->indexToBufferBlock);
    if (sVar3 <= i_4) break;
    pvVar4 = std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::
             operator[](&this->indexToBufferBlock,i_4);
    TObjectReflection::dump(pvVar4);
    i_4 = i_4 + 1;
  }
  printf("\n");
  printf("Pipeline input reflection:\n");
  i_5 = 0;
  while( true ) {
    sVar3 = std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::
            size(&this->indexToPipeInput);
    if (sVar3 <= i_5) break;
    pvVar4 = std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::
             operator[](&this->indexToPipeInput,i_5);
    TObjectReflection::dump(pvVar4);
    i_5 = i_5 + 1;
  }
  printf("\n");
  printf("Pipeline output reflection:\n");
  uStack_40 = 0;
  while( true ) {
    sVar3 = std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::
            size(&this->indexToPipeOutput);
    if (sVar3 <= uStack_40) break;
    pvVar4 = std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::
             operator[](&this->indexToPipeOutput,uStack_40);
    TObjectReflection::dump(pvVar4);
    uStack_40 = uStack_40 + 1;
  }
  printf("\n");
  uVar2 = getLocalSize(this,0);
  if (1 < uVar2) {
    for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
      uVar2 = getLocalSize(this,local_44);
      if (1 < uVar2) {
        pcVar1 = dump::axis[local_44];
        uVar2 = getLocalSize(this,local_44);
        printf("Local size %s: %u\n",pcVar1,(ulong)uVar2);
      }
    }
    printf("\n");
  }
  return;
}

Assistant:

void TReflection::dump()
{
    printf("Uniform reflection:\n");
    for (size_t i = 0; i < indexToUniform.size(); ++i)
        indexToUniform[i].dump();
    printf("\n");

    printf("Uniform block reflection:\n");
    for (size_t i = 0; i < indexToUniformBlock.size(); ++i)
        indexToUniformBlock[i].dump();
    printf("\n");

    printf("Buffer variable reflection:\n");
    for (size_t i = 0; i < indexToBufferVariable.size(); ++i)
      indexToBufferVariable[i].dump();
    printf("\n");

    printf("Buffer block reflection:\n");
    for (size_t i = 0; i < indexToBufferBlock.size(); ++i)
      indexToBufferBlock[i].dump();
    printf("\n");

    printf("Pipeline input reflection:\n");
    for (size_t i = 0; i < indexToPipeInput.size(); ++i)
        indexToPipeInput[i].dump();
    printf("\n");

    printf("Pipeline output reflection:\n");
    for (size_t i = 0; i < indexToPipeOutput.size(); ++i)
        indexToPipeOutput[i].dump();
    printf("\n");

    if (getLocalSize(0) > 1) {
        static const char* axis[] = { "X", "Y", "Z" };

        for (int dim=0; dim<3; ++dim)
            if (getLocalSize(dim) > 1)
                printf("Local size %s: %u\n", axis[dim], getLocalSize(dim));

        printf("\n");
    }

    // printf("Live names\n");
    // for (TNameToIndex::const_iterator it = nameToIndex.begin(); it != nameToIndex.end(); ++it)
    //    printf("%s: %d\n", it->first.c_str(), it->second);
    // printf("\n");
}